

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

BVSparse<Memory::JitArenaAllocator> * __thiscall
BasicBlock::EnsureTypeIDsWithFinalType(BasicBlock *this,JitArenaAllocator *alloc)

{
  JitArenaAllocator *alloc_00;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  TrackAllocData local_40;
  JitArenaAllocator *local_18;
  JitArenaAllocator *alloc_local;
  BasicBlock *this_local;
  
  if (this->typeIDsWithFinalType == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    local_18 = alloc;
    alloc_local = (JitArenaAllocator *)this;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
               ,0xce9);
    alloc_00 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              alloc,&local_40);
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,alloc_00,0x4e98c0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,local_18);
    this->typeIDsWithFinalType = this_00;
  }
  return this->typeIDsWithFinalType;
}

Assistant:

BVSparse<JitArenaAllocator> *
BasicBlock::EnsureTypeIDsWithFinalType(JitArenaAllocator *alloc)
{
    if (typeIDsWithFinalType == nullptr)
    {
         typeIDsWithFinalType = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    }
    return typeIDsWithFinalType;
}